

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::fill<long>(Write<long> *a,long val)

{
  Alloc *pAVar1;
  size_t sVar2;
  type_conflict1 f;
  type_conflict1 local_30;
  
  Write<long>::Write((Write<int> *)&local_30,(Write<int> *)a);
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_30.val = val;
  parallel_for<Omega_h::fill<long>(Omega_h::Write<long>,long)::_lambda(int)_1_>
            ((LO)(sVar2 >> 3),&local_30,"Write(size,value)");
  Write<long>::~Write(&local_30.a);
  return;
}

Assistant:

void fill(Write<T> a, T val) {
  auto f = OMEGA_H_LAMBDA(LO i) { a[i] = val; };
  parallel_for(a.size(), f, "Write(size,value)");
}